

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

void Am_Initialize_Search_DB(void)

{
  Am_Slot_Key AVar1;
  Am_Slot_Key key;
  Am_Object *pAVar2;
  Am_Constraint *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Object *pAVar6;
  Am_Value_List *pAVar7;
  Am_Value_List local_100;
  Am_Object local_f0;
  Am_Formula local_e8;
  Am_Formula local_d8;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  Am_Font::Am_Font((Am_Font *)&local_100,Am_FONT_FIXED,true,false,false,Am_FONT_LARGE);
  Am_Font::operator=(&search_big_font,(Am_Font *)&local_100);
  Am_Font::~Am_Font((Am_Font *)&local_100);
  Am_Font::Am_Font((Am_Font *)&local_100,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  Am_Font::operator=(&search_bold_font,(Am_Font *)&local_100);
  Am_Font::~Am_Font((Am_Font *)&local_100);
  Am_Object::Create((Am_Object *)&local_e8,(char *)&Am_Checkbox);
  pAVar2 = Am_Object::Set((Am_Object *)&local_e8,100,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,3,0);
  Am_Object::Get_Object((Am_Object *)&local_d8,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set((Am_Object *)&local_d8,0x153,true,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&label_from_saved_old_owner);
  pAVar2 = Am_Object::Set(pAVar2,0x150,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&active_from_saved_old_owner);
  pAVar2 = Am_Object::Set(pAVar2,0xcc,pAVar3,0);
  pAVar2 = Am_Object::Set(pAVar2,0x154,-1,0);
  Am_Object::Get_Owner((Am_Object *)&local_100,(Am_Slot_Flags)pAVar2);
  Am_Object::operator=(&search_use_item_proto,(Am_Object *)&local_100);
  Am_Object::~Am_Object((Am_Object *)&local_100);
  Am_Object::~Am_Object((Am_Object *)&local_d8);
  Am_Object::~Am_Object((Am_Object *)&local_e8);
  Am_Object::Create(&local_f0,(char *)&Am_Window);
  pAVar2 = Am_Object::Set(&local_f0,0x89,Am_Default_Pop_Up_Window_Destroy_Method.from_wrapper,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x6c,"Search For",0);
  pAVar2 = Am_Object::Set(pAVar2,0x66,0x1c2,0);
  pAVar2 = Am_Object::Set(pAVar2,0x67,0x1ef,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_SLOTS_TO_ITEMS,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0x197,0,0);
  Am_Object::Create(&local_40,(char *)&Am_Text);
  pAVar5 = Am_Object::Set(&local_40,100,6,0);
  pAVar5 = Am_Object::Set(pAVar5,0x65,0xb,0);
  pAVar5 = Am_Object::Set(pAVar5,0xab,"Search for an Object with Values:",0);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&search_big_font);
  pAVar5 = Am_Object::Set(pAVar5,0xac,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar5 = Am_Object::Set(pAVar5,0x6b,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar5 = Am_Object::Set(pAVar5,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_38,pAVar5);
  pAVar2 = Am_Object::Add_Part(pAVar2,&local_38,true,0);
  Am_Object::Create(&local_50,(char *)&Am_Button_Panel);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar5 = Am_Object::Set(&local_50,100,pAVar3,0);
  pAVar5 = Am_Object::Set(pAVar5,0x65,0x2b,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar5 = Am_Object::Set(pAVar5,0x6a,pAVar4,0);
  Am_Value_List::Am_Value_List(&local_100);
  Am_Object::Create(&local_58,(char *)&Am_Command);
  pAVar6 = Am_Object::Set(&local_58,0x150,"Load from Selected Object",0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&one_object_selected);
  pAVar6 = Am_Object::Set(pAVar6,0xcc,pAVar3,0);
  pAVar6 = Am_Object::Set(pAVar6,0xca,do_load_sel_object_search.from_wrapper,0);
  pAVar6 = Am_Object::Set(pAVar6,0x154,-1,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar7 = Am_Value_List::Add(&local_100,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_60,(char *)&Am_Command);
  pAVar6 = Am_Object::Set(&local_60,0x150,"Load from Selected Command",0);
  pAVar6 = Am_Object::Set(pAVar6,0xcc,true,0);
  pAVar6 = Am_Object::Set(pAVar6,0xca,0,0);
  pAVar6 = Am_Object::Set(pAVar6,0x154,-1,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar5 = Am_Object::Set(pAVar5,0xa2,pAVar4,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar5 = Am_Object::Set(pAVar5,0x94,pAVar3,0);
  pAVar5 = Am_Object::Set(pAVar5,0x95,0x14,0);
  pAVar5 = Am_Object::Set(pAVar5,0x96,0,0);
  Am_Object::Am_Object(&local_48,pAVar5);
  pAVar2 = Am_Object::Add_Part(pAVar2,&local_48,true,0);
  Am_Object::Create(&local_70,(char *)&Am_Text);
  pAVar5 = Am_Object::Set(&local_70,100,7,0);
  pAVar5 = Am_Object::Set(pAVar5,0x65,0x4e,0);
  pAVar5 = Am_Object::Set(pAVar5,0xab,"Check the:",0);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&search_bold_font);
  pAVar5 = Am_Object::Set(pAVar5,0xac,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar5 = Am_Object::Set(pAVar5,0x6b,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar5 = Am_Object::Set(pAVar5,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_68,pAVar5);
  pAVar2 = Am_Object::Add_Part(pAVar2,&local_68,true,0);
  key = Am_TYPE_USE_ITEM;
  Am_Object::Create(&local_80,(char *)&Am_Group);
  pAVar5 = Am_Object::Set(&local_80,100,5,0);
  pAVar5 = Am_Object::Set(pAVar5,0x65,0x5e,0);
  pAVar5 = Am_Object::Set(pAVar5,0x66,0x1b8,0);
  pAVar5 = Am_Object::Set(pAVar5,0x67,0x26,0);
  pAVar5 = Am_Object::Add(pAVar5,0x150,"Type of Object",0);
  pAVar5 = Am_Object::Add(pAVar5,0xcc,true,0);
  pAVar5 = Am_Object::Add(pAVar5,0xa2,0,0);
  Am_Object::Create(&local_90,(char *)&Am_Border_Rectangle);
  pAVar6 = Am_Object::Set(&local_90,100,0,0);
  pAVar6 = Am_Object::Set(pAVar6,0x65,0,0);
  pAVar6 = Am_Object::Set(pAVar6,0x66,0x1b8,0);
  Am_From_Owner((Am_Slot_Key)&local_d8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_d8);
  pAVar6 = Am_Object::Set(pAVar6,0x67,pAVar3,0);
  pAVar6 = Am_Object::Set(pAVar6,0x172,0,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar6 = Am_Object::Set(pAVar6,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_88,pAVar6);
  pAVar5 = Am_Object::Add_Part(pAVar5,&local_88,true,0);
  AVar1 = Am_USE_ITEM;
  Am_Object::Create(&local_a0,(char *)&search_use_item_proto);
  pAVar6 = Am_Object::Set(&local_a0,100,10,0);
  pAVar6 = Am_Object::Set(pAVar6,0x65,9,0);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&search_bold_font);
  pAVar6 = Am_Object::Set(pAVar6,0xac,pAVar4,0);
  Am_Object::Am_Object(&local_98,pAVar6);
  pAVar5 = Am_Object::Add_Part(pAVar5,AVar1,&local_98,0);
  AVar1 = Am_ITEM_VALUE;
  Am_Object::Create(&local_b8,(char *)&Am_Option_Button);
  pAVar6 = Am_Object::Set(&local_b8,100,0x92,0);
  pAVar6 = Am_Object::Set(pAVar6,0x65,0,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar6 = Am_Object::Set(pAVar6,0x6a,pAVar4,0);
  Am_From_Owner((Am_Slot_Key)&local_e8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_e8);
  pAVar6 = Am_Object::Set(pAVar6,0xa2,pAVar3,0);
  Am_Object::Get_Object(&local_b0,(Am_Slot_Key)pAVar6,0xc5);
  pAVar6 = Am_Object::Set(&local_b0,0x150,"Pick Type",0);
  pAVar6 = Am_Object::Set(pAVar6,0x154,-1,0);
  pAVar6 = Am_Object::Set(pAVar6,0xca,new_item_value.from_wrapper,0);
  Am_Object::Get_Owner(&local_a8,(Am_Slot_Flags)pAVar6);
  pAVar5 = Am_Object::Add_Part(pAVar5,AVar1,&local_a8,0);
  Am_Object::Am_Object(&local_78,pAVar5);
  pAVar2 = Am_Object::Add_Part(pAVar2,key,&local_78,0);
  Am_Object::operator=(&Am_Search_Window,pAVar2);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_b0);
  Am_Formula::~Am_Formula(&local_e8);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_88);
  Am_Formula::~Am_Formula(&local_d8);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Value_List::~Am_Value_List(&local_100);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::Create((Am_Object *)&local_d8,(char *)&Am_Group);
  pAVar2 = Am_Object::Add((Am_Object *)&local_d8,0x150,"Left",0);
  pAVar2 = Am_Object::Add(pAVar2,0xcc,true,0);
  pAVar2 = Am_Object::Add(pAVar2,0x11d,0x44,0);
  pAVar2 = Am_Object::Set(pAVar2,100,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x66,0x1b8,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Height_Of_Parts);
  pAVar2 = Am_Object::Set(pAVar2,0x67,pAVar3,0);
  AVar1 = Am_USE_ITEM;
  Am_Object::Create(&local_c0,(char *)&search_use_item_proto);
  pAVar2 = Am_Object::Add_Part(pAVar2,AVar1,&local_c0,0);
  AVar1 = Am_ITEM_VALUE;
  Am_Object::Create(&local_f0,(char *)&Am_Text_Input_Widget);
  Am_From_Owner((Am_Slot_Key)&local_100);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_100);
  pAVar5 = Am_Object::Set(&local_f0,100,pAVar3,0);
  pAVar5 = Am_Object::Set(pAVar5,0x65,0,0);
  pAVar5 = Am_Object::Add(pAVar5,0xfa,&Am_No_Value,0);
  pAVar5 = Am_Object::Set(pAVar5,0xe6,am_check_valid_type.from_wrapper,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&item_value_width);
  pAVar5 = Am_Object::Set(pAVar5,0x66,pAVar3,0);
  Am_Object::Get_Object((Am_Object *)&local_e8,(Am_Slot_Key)pAVar5,0xc5);
  pAVar5 = Am_Object::Set((Am_Object *)&local_e8,0x150,"",0);
  pAVar5 = Am_Object::Set(pAVar5,0x154,-1,0);
  pAVar5 = Am_Object::Set(pAVar5,0xca,new_item_value.from_wrapper,0);
  Am_Object::Get_Owner(&local_c8,(Am_Slot_Flags)pAVar5);
  pAVar2 = Am_Object::Add_Part(pAVar2,AVar1,&local_c8,0);
  Am_Object::operator=(&search_item_proto,pAVar2);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object((Am_Object *)&local_e8);
  Am_Formula::~Am_Formula((Am_Formula *)&local_100);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object((Am_Object *)&local_d8);
  Am_Object::Create((Am_Object *)&local_100,(char *)&Am_Select_Command);
  pAVar2 = Am_Object::Add((Am_Object *)&local_100,0x197,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0xef,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x150,"Find",0);
  pAVar2 = Am_Object::Set(pAVar2,0xca,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x146,undo_find.from_wrapper,0);
  pAVar2 = Am_Object::Set(pAVar2,0x147,undo_find.from_wrapper,0);
  pAVar2 = Am_Object::Set(pAVar2,0x148,undo_find.from_wrapper,0);
  pAVar2 = Am_Object::Set(pAVar2,0x149,find_repeat_same.from_wrapper,0);
  pAVar2 = Am_Object::Set(pAVar2,0x14a,find_repeat_new.from_wrapper,0);
  pAVar2 = Am_Object::Set(pAVar2,0x14d,Am_Selective_New_Allowed_Return_True.from_wrapper,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&find_get_sel_widgets_impl_parent);
  pAVar2 = Am_Object::Set(pAVar2,0x154,pAVar3,0);
  Am_Object::operator=(&Am_Find_Command,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&local_100);
  Am_Object::Create((Am_Object *)&local_100,(char *)&Am_Command);
  pAVar2 = Am_Object::Set((Am_Object *)&local_100,0x150,"Find...",0);
  pAVar2 = Am_Object::Set(pAVar2,0xca,pop_up_search_window.from_wrapper,0);
  pAVar2 = Am_Object::Set(pAVar2,0x154,-1,0);
  pAVar2 = Am_Object::Add(pAVar2,0x197,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_SEARCH_DIALOG,0,0);
  Am_Object::operator=(&Am_Show_Search_Command,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&local_100);
  Am_Object::Create((Am_Object *)&local_100,(char *)&Am_Root_Object);
  Am_Object::operator=(&Am_Fake_Start_Object,(Am_Object *)&local_100);
  Am_Object::~Am_Object((Am_Object *)&local_100);
  return;
}

Assistant:

void
Am_Initialize_Search_DB()
{
  search_big_font = Am_Font(Am_FONT_FIXED, true, false, false, Am_FONT_LARGE);
  search_bold_font = Am_Font(Am_FONT_FIXED, true, false, false, Am_FONT_MEDIUM);
  search_use_item_proto =
      Am_Checkbox.Create(DSTR("use_item"))
          .Set(Am_LEFT, 0)
          .Set(Am_TOP, 3)
          .Get_Object(Am_COMMAND)
          .Set(Am_ID, true)
          .Set(Am_LABEL, label_from_saved_old_owner)
          .Set(Am_ACTIVE, active_from_saved_old_owner)
          .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
          .Get_Owner();
  Am_Search_Window =
      Am_Window.Create(DSTR("Search Window"))
          .Set(Am_DESTROY_WINDOW_METHOD,
               Am_Default_Pop_Up_Window_Destroy_Method)
          .Set(Am_FILL_STYLE, Am_Default_Color)
          .Set(Am_TITLE, "Search For")
          .Set(Am_WIDTH, WINDOW_WIDTH)
          .Set(Am_HEIGHT, 495)
          .Add(Am_SLOTS_TO_ITEMS, (0L))
          .Add(Am_SELECTION_WIDGET, (0L))
          .Add_Part(Am_Text.Create()
                        .Set(Am_LEFT, 6)
                        .Set(Am_TOP, 11)
                        .Set(Am_TEXT, "Search for an Object with Values:")
                        .Set(Am_FONT, search_big_font)
                        .Set(Am_LINE_STYLE, Am_Black)
                        .Set(Am_FILL_STYLE, Am_No_Style))
          .Add_Part(
              Am_Button_Panel.Create()
                  .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                  .Set(Am_TOP, 43)
                  .Set(Am_FILL_STYLE, Am_Default_Color)
                  .Set(
                      Am_ITEMS,
                      Am_Value_List()
                          .Add(Am_Command.Create()
                                   .Set(Am_LABEL, "Load from Selected Object")
                                   .Set(Am_ACTIVE, one_object_selected)
                                   .Set(Am_DO_METHOD, do_load_sel_object_search)
                                   .Set(Am_IMPLEMENTATION_PARENT,
                                        Am_NOT_USUALLY_UNDONE))
                          .Add(Am_Command.Create()
                                   .Set(Am_LABEL, "Load from Selected Command")
                                   .Set(Am_ACTIVE,
                                        /* ok_load_sel_command_search */ true)
                                   .Set(Am_DO_METHOD,
                                        /* do_load_sel_command_search */ (0L))
                                   .Set(Am_IMPLEMENTATION_PARENT,
                                        Am_NOT_USUALLY_UNDONE)))
                  .Set(Am_LAYOUT, Am_Horizontal_Layout)
                  .Set(Am_H_SPACING, 20)
                  .Set(Am_V_SPACING, 0))
          .Add_Part(Am_Text.Create()
                        .Set(Am_LEFT, 7)
                        .Set(Am_TOP, 78)
                        .Set(Am_TEXT, "Check the:")
                        .Set(Am_FONT, search_bold_font)
                        .Set(Am_LINE_STYLE, Am_Black)
                        .Set(Am_FILL_STYLE, Am_No_Style))
          .Add_Part(Am_TYPE_USE_ITEM,
                    Am_Group.Create(DSTR("TYPE_GROUP"))
                        .Set(Am_LEFT, 5)
                        .Set(Am_TOP, 94)
                        .Set(Am_WIDTH, WINDOW_WIDTH - 10)
                        .Set(Am_HEIGHT, 38)
                        .Add(Am_LABEL, "Type of Object")
                        .Add(Am_ACTIVE, true)
                        .Add(Am_ITEMS, (0L))
                        .Add_Part(Am_Border_Rectangle.Create()
                                      .Set(Am_LEFT, 0)
                                      .Set(Am_TOP, 0)
                                      .Set(Am_WIDTH, WINDOW_WIDTH - 10)
                                      .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                                      .Set(Am_SELECTED, 0)
                                      .Set(Am_FILL_STYLE, Am_Default_Color))
                        .Add_Part(Am_USE_ITEM,
                                  search_use_item_proto.Create(DSTR("Use_Type"))
                                      .Set(Am_LEFT, 10)
                                      .Set(Am_TOP, 9)
                                      .Set(Am_FONT, search_bold_font))
                        .Add_Part(Am_ITEM_VALUE,
                                  Am_Option_Button.Create(DSTR("Types"))
                                      .Set(Am_LEFT, 146)
                                      .Set(Am_TOP, 0)
                                      .Set(Am_FILL_STYLE, Am_Default_Color)
                                      .Set(Am_ITEMS, Am_From_Owner(Am_ITEMS))
                                      .Get_Object(Am_COMMAND)
                                      .Set(Am_LABEL, "Pick Type")
                                      .Set(Am_IMPLEMENTATION_PARENT,
                                           Am_NOT_USUALLY_UNDONE)
                                      .Set(Am_DO_METHOD, new_item_value)
                                      .Get_Owner()

                                      )) //end type_group
      ;

  search_item_proto =
      Am_Group.Create(DSTR("search_item_proto"))
          .Add(Am_LABEL, "Left")
          .Add(Am_ACTIVE, true)
          .Add(Am_X_OFFSET, 68)
          .Set(Am_LEFT, 0)
          .Set(Am_TOP, 0)
          .Set(Am_WIDTH, WINDOW_WIDTH - 10)
          .Set(Am_HEIGHT, Am_Height_Of_Parts)
          .Add_Part(Am_USE_ITEM, search_use_item_proto.Create())
          .Add_Part(
              Am_ITEM_VALUE,
              Am_Text_Input_Widget.Create(DSTR("item_value"))
                  .Set(Am_LEFT, Am_From_Owner(Am_X_OFFSET))
                  .Set(Am_TOP, 0)
                  .Add(Am_VALUES, Am_No_Value) // the real value calculated
                  // am_check_valid_type defined in valgen.cc
                  .Set(Am_TEXT_CHECK_LEGAL_METHOD, am_check_valid_type)
                  .Set(Am_WIDTH, item_value_width)

                  .Get_Object(Am_COMMAND)
                  .Set(Am_LABEL, "")
                  .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                  .Set(Am_DO_METHOD, new_item_value)
                  .Get_Owner());
  Am_Find_Command =
      Am_Select_Command.Create(DSTR("Find_Command"))
          .Add(Am_SELECTION_WIDGET,
               (0L)) //set this to associated sel..han..widget
          .Add(Am_CURRENT_DIRECTION, (0L))
          .Set(Am_LABEL, "Find")
          .Set(Am_DO_METHOD, (0L)) //set in the instances
          .Set(Am_UNDO_METHOD, undo_find)
          .Set(Am_REDO_METHOD, undo_find)
          .Set(Am_SELECTIVE_UNDO_METHOD, undo_find)
          .Set(Am_SELECTIVE_REPEAT_SAME_METHOD, find_repeat_same)
          .Set(Am_SELECTIVE_REPEAT_ON_NEW_METHOD, find_repeat_new)
          .Set(Am_SELECTIVE_REPEAT_NEW_ALLOWED,
               Am_Selective_New_Allowed_Return_True)
          .Set(Am_IMPLEMENTATION_PARENT, find_get_sel_widgets_impl_parent);
  Am_Show_Search_Command =
      Am_Command.Create(DSTR("Show Search Window"))
          .Set(Am_LABEL, "Find...")
          .Set(Am_DO_METHOD, pop_up_search_window)
          .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
          .Add(Am_SELECTION_WIDGET, (0L)) //must be set
          .Add(Am_SEARCH_DIALOG, (0L))    //must be set
      ;
  Am_Fake_Start_Object = Am_Root_Object.Create(DSTR("Fake_Start_Object"));
}